

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O1

void __thiscall hdc::Symbol::Symbol(Symbol *this,Def *def)

{
  int iVar1;
  
  (this->overloadedDescriptors).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->overloadedDescriptors).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->overloadedDescriptors).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->kind = SYMBOL_DEF;
  this->descriptor = def;
  iVar1 = Def::getLine(def);
  this->line = iVar1;
  iVar1 = Def::getColumn(def);
  this->column = iVar1;
  return;
}

Assistant:

hdc::Symbol::Symbol(hdc::Def* def) {
    kind = SYMBOL_DEF;
    descriptor = def;
    line = def->getLine();
    column = def->getColumn();
}